

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O0

bool absl::debugging_internal::ParseType(State *state)

{
  bool bVar1;
  undefined1 uVar2;
  State *in_RDI;
  int *unaff_retaddr;
  State *in_stack_00000008;
  bool result_1;
  bool result;
  ParseState copy;
  ComplexityGuard guard;
  undefined1 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffb9;
  undefined1 in_stack_ffffffffffffffba;
  undefined1 in_stack_ffffffffffffffbb;
  undefined4 in_stack_ffffffffffffffbc;
  undefined7 in_stack_ffffffffffffffc0;
  char in_stack_ffffffffffffffc7;
  State *state_00;
  char *char_class;
  State *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe4;
  undefined1 accept_std;
  ComplexityGuard in_stack_ffffffffffffffe8;
  bool local_1;
  
  accept_std = (undefined1)((uint)in_stack_ffffffffffffffe4 >> 0x18);
  anon_unknown_3::ComplexityGuard::ComplexityGuard
            ((ComplexityGuard *)&stack0xffffffffffffffe8,in_RDI);
  bVar1 = anon_unknown_3::ComplexityGuard::IsTooComplex((ComplexityGuard *)&stack0xffffffffffffffe8)
  ;
  if (bVar1) {
    local_1 = false;
  }
  else {
    state_00 = *(State **)&in_RDI->parse_state;
    char_class = *(char **)&(in_RDI->parse_state).prev_name_idx;
    uVar2 = ParseCVQualifiers((State *)CONCAT44(in_stack_ffffffffffffffbc,
                                                CONCAT13(in_stack_ffffffffffffffbb,
                                                         CONCAT12(in_stack_ffffffffffffffba,
                                                                  CONCAT11(in_stack_ffffffffffffffb9
                                                                           ,
                                                  in_stack_ffffffffffffffb8)))));
    if ((bool)uVar2) {
      local_1 = ParseType(in_stack_ffffffffffffffe8.state_);
      if (!local_1) {
        *(State **)&in_RDI->parse_state = state_00;
        *(char **)&(in_RDI->parse_state).prev_name_idx = char_class;
      }
    }
    else {
      *(State **)&in_RDI->parse_state = state_00;
      *(char **)&(in_RDI->parse_state).prev_name_idx = char_class;
      bVar1 = ParseCharClass(in_stack_ffffffffffffffd8,char_class);
      if (bVar1) {
        local_1 = ParseType(in_stack_ffffffffffffffe8.state_);
        if (!local_1) {
          *(State **)&in_RDI->parse_state = state_00;
          *(char **)&(in_RDI->parse_state).prev_name_idx = char_class;
        }
      }
      else {
        *(State **)&in_RDI->parse_state = state_00;
        *(char **)&(in_RDI->parse_state).prev_name_idx = char_class;
        bVar1 = ParseTwoCharToken(state_00,(char *)CONCAT17(in_stack_ffffffffffffffc7,
                                                            in_stack_ffffffffffffffc0));
        if ((bVar1) && (bVar1 = ParseType(in_stack_ffffffffffffffe8.state_), bVar1)) {
          local_1 = true;
        }
        else {
          *(State **)&in_RDI->parse_state = state_00;
          *(char **)&(in_RDI->parse_state).prev_name_idx = char_class;
          bVar1 = ParseBuiltinType(in_stack_ffffffffffffffe8.state_);
          if (((((bVar1) || (bVar1 = ParseFunctionType(in_stack_ffffffffffffffd8), bVar1)) ||
               (bVar1 = ParseClassEnumType(in_stack_ffffffffffffffd8), bVar1)) ||
              ((bVar1 = ParseArrayType(in_stack_ffffffffffffffd8), bVar1 ||
               (bVar1 = ParsePointerToMemberType(state_00), bVar1)))) ||
             ((bVar1 = ParseDecltype(state_00), bVar1 ||
              (bVar1 = ParseSubstitution(in_stack_ffffffffffffffe8.state_,(bool)accept_std), bVar1))
             )) {
            local_1 = true;
          }
          else {
            bVar1 = ParseTemplateTemplateParam
                              ((State *)CONCAT44(in_stack_ffffffffffffffbc,
                                                 CONCAT13(in_stack_ffffffffffffffbb,
                                                          CONCAT12(in_stack_ffffffffffffffba,
                                                                   CONCAT11(uVar2,
                                                  in_stack_ffffffffffffffb8)))));
            if ((bVar1) && (bVar1 = ParseTemplateArgs(in_stack_ffffffffffffffd8), bVar1)) {
              local_1 = true;
            }
            else {
              *(State **)&in_RDI->parse_state = state_00;
              *(char **)&(in_RDI->parse_state).prev_name_idx = char_class;
              bVar1 = ParseTemplateParam(in_stack_ffffffffffffffd8);
              if (bVar1) {
                local_1 = true;
              }
              else {
                bVar1 = ParseTwoCharToken(state_00,(char *)CONCAT17(in_stack_ffffffffffffffc7,
                                                                    in_stack_ffffffffffffffc0));
                if ((((bVar1) && (bVar1 = ParseNumber(in_stack_00000008,unaff_retaddr), bVar1)) &&
                    (bVar1 = ParseOneCharToken(state_00,in_stack_ffffffffffffffc7), bVar1)) &&
                   (bVar1 = ParseType(in_stack_ffffffffffffffe8.state_), bVar1)) {
                  local_1 = true;
                }
                else {
                  *(State **)&in_RDI->parse_state = state_00;
                  *(char **)&(in_RDI->parse_state).prev_name_idx = char_class;
                  bVar1 = ParseTwoCharToken(state_00,(char *)CONCAT17(in_stack_ffffffffffffffc7,
                                                                      in_stack_ffffffffffffffc0));
                  if (((bVar1) && (bVar1 = ParseExpression(state), bVar1)) &&
                     ((bVar1 = ParseOneCharToken(state_00,in_stack_ffffffffffffffc7), bVar1 &&
                      (bVar1 = ParseType(in_stack_ffffffffffffffe8.state_), bVar1)))) {
                    local_1 = true;
                  }
                  else {
                    *(State **)&in_RDI->parse_state = state_00;
                    *(char **)&(in_RDI->parse_state).prev_name_idx = char_class;
                    bVar1 = ParseTwoCharToken(state_00,(char *)CONCAT17(in_stack_ffffffffffffffc7,
                                                                        in_stack_ffffffffffffffc0));
                    if ((bVar1) && (bVar1 = ParseTypeConstraint((State *)0x3b5e40), bVar1)) {
                      local_1 = true;
                    }
                    else {
                      *(State **)&in_RDI->parse_state = state_00;
                      *(char **)&(in_RDI->parse_state).prev_name_idx = char_class;
                      local_1 = ParseLongToken(state_00,(char *)CONCAT17(in_stack_ffffffffffffffc7,
                                                                         in_stack_ffffffffffffffc0))
                      ;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  anon_unknown_3::ComplexityGuard::~ComplexityGuard((ComplexityGuard *)&stack0xffffffffffffffe8);
  return local_1;
}

Assistant:

static bool ParseType(State *state) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;
  ParseState copy = state->parse_state;

  // We should check CV-qualifers, and PRGC things first.
  //
  // CV-qualifiers overlap with some operator names, but an operator name is not
  // valid as a type.  To avoid an ambiguity that can lead to exponential time
  // complexity, refuse to backtrack the CV-qualifiers.
  //
  // _Z4aoeuIrMvvE
  //  => _Z 4aoeuI        rM  v     v   E
  //         aoeu<operator%=, void, void>
  //  => _Z 4aoeuI r Mv v              E
  //         aoeu<void void::* restrict>
  //
  // By consuming the CV-qualifiers first, the former parse is disabled.
  if (ParseCVQualifiers(state)) {
    const bool result = ParseType(state);
    if (!result) state->parse_state = copy;
    return result;
  }
  state->parse_state = copy;

  // Similarly, these tag characters can overlap with other <name>s resulting in
  // two different parse prefixes that land on <template-args> in the same
  // place, such as "C3r1xI...".  So, disable the "ctor-name = C3" parse by
  // refusing to backtrack the tag characters.
  if (ParseCharClass(state, "OPRCG")) {
    const bool result = ParseType(state);
    if (!result) state->parse_state = copy;
    return result;
  }
  state->parse_state = copy;

  if (ParseTwoCharToken(state, "Dp") && ParseType(state)) {
    return true;
  }
  state->parse_state = copy;

  if (ParseBuiltinType(state) || ParseFunctionType(state) ||
      ParseClassEnumType(state) || ParseArrayType(state) ||
      ParsePointerToMemberType(state) || ParseDecltype(state) ||
      // "std" on its own isn't a type.
      ParseSubstitution(state, /*accept_std=*/false)) {
    return true;
  }

  if (ParseTemplateTemplateParam(state) && ParseTemplateArgs(state)) {
    return true;
  }
  state->parse_state = copy;

  // Less greedy than <template-template-param> <template-args>.
  if (ParseTemplateParam(state)) {
    return true;
  }

  // GNU vector extension Dv <number> _ <type>
  if (ParseTwoCharToken(state, "Dv") && ParseNumber(state, nullptr) &&
      ParseOneCharToken(state, '_') && ParseType(state)) {
    return true;
  }
  state->parse_state = copy;

  // GNU vector extension Dv <expression> _ <type>
  if (ParseTwoCharToken(state, "Dv") && ParseExpression(state) &&
      ParseOneCharToken(state, '_') && ParseType(state)) {
    return true;
  }
  state->parse_state = copy;

  if (ParseTwoCharToken(state, "Dk") && ParseTypeConstraint(state)) {
    return true;
  }
  state->parse_state = copy;

  // For this notation see CXXNameMangler::mangleType in Clang's source code.
  // The relevant logic and its comment "not clear how to mangle this!" date
  // from 2011, so it may be with us awhile.
  return ParseLongToken(state, "_SUBSTPACK_");
}